

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O2

void __thiscall
Eigen::internal::CompressedStorage<double,_int>::resize
          (CompressedStorage<double,_int> *this,size_t size,double reserveSizeFactor)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  
  if (this->m_allocatedSize < size) {
    auVar2._8_4_ = (int)(size >> 0x20);
    auVar2._0_8_ = size;
    auVar2._12_4_ = 0x45300000;
    dVar3 = ((auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0)) * reserveSizeFactor;
    uVar1 = (ulong)dVar3;
    reallocate(this,((long)(dVar3 - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1) + size);
  }
  this->m_size = size;
  return;
}

Assistant:

void resize(size_t size, double reserveSizeFactor = 0)
    {
      if (m_allocatedSize<size)
        reallocate(size + size_t(reserveSizeFactor*double(size)));
      m_size = size;
    }